

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cn-cbor.c
# Opt level: O1

cn_cbor * cn_cbor_decode(uchar *buf,size_t len,cn_cbor_errback *errp)

{
  anon_union_8_7_1acfe125_for_v *paVar1;
  byte bVar2;
  cn_cbor_type cVar3;
  ulong uVar4;
  cn_cbor *pcVar5;
  cn_cbor *pcVar6;
  cn_cbor *pcVar7;
  cn_cbor **ppcVar8;
  byte *pbVar9;
  cn_cbor_error cVar10;
  byte *pbVar11;
  cn_cbor catcher;
  int local_70;
  cn_cbor local_68;
  
  local_68.v.bytes = (uint8_t *)0x0;
  local_68.last_child = (cn_cbor *)0x0;
  local_68.next = (cn_cbor *)0x0;
  local_68.length = 0;
  local_68._20_4_ = 0;
  local_68.first_child = (cn_cbor *)0x0;
  local_68.parent = (cn_cbor *)0x0;
  local_68.type = CN_CBOR_INVALID;
  local_68.flags = 0;
  cVar10 = CN_CBOR_ERR_OUT_OF_DATA;
  pbVar11 = buf;
  if (len == 0) {
    pcVar6 = (cn_cbor *)0x0;
  }
  else {
    pbVar9 = buf + len;
    pcVar6 = &local_68;
    pcVar5 = (cn_cbor *)0x0;
    do {
      bVar2 = *pbVar11;
      pbVar11 = pbVar11 + 1;
      if (bVar2 == 0xff) {
        if ((pcVar6->flags & CN_CBOR_FL_INDEF) == 0) {
          cVar10 = CN_CBOR_ERR_BREAK_OUTSIDE_INDEF;
          goto LAB_001ffae8;
        }
        cVar3 = pcVar6->type;
        pcVar7 = pcVar5;
        if (cVar3 - CN_CBOR_BYTES < 2) {
          pcVar6->type = cVar3 + CN_CBOR_NULL;
        }
        else if ((cVar3 == CN_CBOR_MAP) && ((pcVar6->length & 1) != 0)) {
          cVar10 = CN_CBOR_ERR_ODD_SIZE_INDEF_MAP;
          goto LAB_001ffae8;
        }
        do {
          do {
            pcVar5 = pcVar6;
            if (pcVar5 == &local_68) {
              pcVar6 = (cn_cbor *)0x0;
              if (pbVar11 == pbVar9) {
                pcVar6 = pcVar7;
              }
              cVar10 = (uint)(pbVar11 != pbVar9) * 2;
              goto LAB_001ffaea;
            }
            pcVar6 = pcVar5->parent;
            if ((pcVar6->flags & CN_CBOR_FL_INDEF) != 0) {
              if (((pcVar6->type & ~CN_CBOR_TRUE) == CN_CBOR_BYTES) &&
                 (pcVar5->type != pcVar6->type)) {
                cVar10 = CN_CBOR_ERR_WRONG_NESTING_IN_INDEF_STRING;
                goto LAB_001ffae8;
              }
              goto LAB_001ffa7e;
            }
            pcVar7 = pcVar5;
          } while ((pcVar6->flags & CN_CBOR_FL_COUNT) == 0);
          paVar1 = &pcVar6->v;
          paVar1->bytes = (uint8_t *)(paVar1->sint + -1);
        } while (paVar1->bytes == (uint8_t *)0x0);
      }
      else {
        pcVar5 = (cn_cbor *)calloc(1,0x38);
        if (pcVar5 == (cn_cbor *)0x0) {
          cVar10 = CN_CBOR_ERR_OUT_OF_MEMORY;
          goto LAB_001ffae8;
        }
        uVar4 = (ulong)(bVar2 >> 5);
        pcVar5->type = mt_trans[uVar4];
        pcVar5->parent = pcVar6;
        ppcVar8 = &pcVar6->last_child->next;
        if (pcVar6->last_child == (cn_cbor *)0x0) {
          ppcVar8 = &pcVar6->first_child;
        }
        *ppcVar8 = pcVar5;
        pcVar6->last_child = pcVar5;
        pcVar6->length = pcVar6->length + 1;
        switch(bVar2 & 0x1f) {
        case 0x18:
          if (pbVar9 != pbVar11) {
            pcVar6 = (cn_cbor *)(*(code *)(&DAT_0023dd40 + *(int *)(&DAT_0023dd40 + uVar4 * 4)))();
            return pcVar6;
          }
          goto LAB_001ffa8a;
        case 0x19:
          if (1 < (ulong)((long)pbVar9 - (long)pbVar11)) {
            pcVar6 = (cn_cbor *)(*(code *)(&DAT_0023dd40 + *(int *)(&DAT_0023dd40 + uVar4 * 4)))();
            return pcVar6;
          }
          goto LAB_001ffa8a;
        case 0x1a:
          if (3 < (ulong)((long)pbVar9 - (long)pbVar11)) {
            pcVar6 = (cn_cbor *)(*(code *)(&DAT_0023dd40 + *(int *)(&DAT_0023dd40 + uVar4 * 4)))();
            return pcVar6;
          }
          goto LAB_001ffa8a;
        case 0x1b:
          if (7 < (ulong)((long)pbVar9 - (long)pbVar11)) {
            pcVar6 = (cn_cbor *)(*(code *)(&DAT_0023dd40 + *(int *)(&DAT_0023dd40 + uVar4 * 4)))();
            return pcVar6;
          }
          goto LAB_001ffa8a;
        case 0x1c:
        case 0x1d:
        case 0x1e:
          cVar10 = CN_CBOR_ERR_RESERVED_AI;
          goto LAB_001ffae8;
        case 0x1f:
          if (5 < (bVar2 >> 5) - 2) {
            cVar10 = CN_CBOR_ERR_MT_UNDEF_FOR_INDEF;
            goto LAB_001ffae8;
          }
          *(undefined1 *)&pcVar5->flags = (char)pcVar5->flags | CN_CBOR_FL_INDEF;
          pcVar6 = pcVar5;
          break;
        default:
          pcVar6 = (cn_cbor *)(*(code *)(&DAT_0023dd40 + *(int *)(&DAT_0023dd40 + uVar4 * 4)))();
          return pcVar6;
        }
      }
LAB_001ffa7e:
    } while (pbVar9 != pbVar11);
LAB_001ffa8a:
    cVar10 = CN_CBOR_ERR_OUT_OF_DATA;
LAB_001ffae8:
    pcVar6 = (cn_cbor *)0x0;
  }
LAB_001ffaea:
  if (pcVar6 == (cn_cbor *)0x0) {
    if (local_68.first_child != (cn_cbor *)0x0) {
      (local_68.first_child)->parent = (cn_cbor *)0x0;
      cn_cbor_free(local_68.first_child);
    }
    if (errp != (cn_cbor_errback *)0x0) {
      errp->err = cVar10;
      local_70 = (int)buf;
      errp->pos = (int)pbVar11 - local_70;
    }
    pcVar6 = (cn_cbor *)0x0;
  }
  else {
    pcVar6->parent = (cn_cbor *)0x0;
  }
  return pcVar6;
}

Assistant:

MYLIB_EXPORT
cn_cbor* cn_cbor_decode(const unsigned char* buf, size_t len CBOR_CONTEXT, cn_cbor_errback *errp) {
  cn_cbor catcher = {CN_CBOR_INVALID, 0, {0}, 0, NULL, NULL, NULL, NULL};
  struct parse_buf pb;
  cn_cbor* ret;

  pb.buf  = (unsigned char *)buf;
  pb.ebuf = (unsigned char *)buf+len;
  pb.err  = CN_CBOR_NO_ERROR;
  ret = decode_item(&pb CBOR_CONTEXT_PARAM, &catcher);
  if (ret != NULL) {
    /* mark as top node */
    ret->parent = NULL;
  } else {
    if (catcher.first_child) {
      catcher.first_child->parent = 0;
      cn_cbor_free(catcher.first_child CBOR_CONTEXT_PARAM);
    }
//fail:
    if (errp) {
      errp->err = pb.err;
      errp->pos = pb.buf - (unsigned char *)buf;
    }
    return NULL;
  }
  return ret;
}